

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cereal.hpp
# Opt level: O2

void __thiscall
cereal::InputArchive<cereal::PortableBinaryInputArchive,1u>::
process<std::__cxx11::string&,std::__cxx11::string&,int&,std::__cxx11::string&>
          (InputArchive<cereal::PortableBinaryInputArchive,1u> *this,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *head,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *tail,int *tail_1,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *tail_2)

{
  process<std::__cxx11::string&>(this,head);
  process<std::__cxx11::string&,int&,std::__cxx11::string&>(this,tail,tail_1,tail_2);
  return;
}

Assistant:

inline
      void process( T && head, Other && ... tail )
      {
        process( std::forward<T>( head ) );
        process( std::forward<Other>( tail )... );
      }